

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

ma_result ma_device_init__null
                    (ma_device *pDevice,ma_device_config *pConfig,
                    ma_device_descriptor *pDescriptorPlayback,
                    ma_device_descriptor *pDescriptorCapture)

{
  ma_channel mVar1;
  ma_uint32 mVar2;
  ma_result mVar3;
  ma_format mVar4;
  ma_uint32 mVar5;
  long lVar6;
  bool bVar7;
  
  if (pDevice == (ma_device *)0x0) {
    __assert_fail("pDevice != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                  ,0x1df4,
                  "ma_result ma_device_init__null(ma_device *, const ma_device_config *, ma_device_descriptor *, ma_device_descriptor *)"
                 );
  }
  memset(&pDevice->field_24,0,0x160);
  if (pConfig->deviceType - ma_device_type_capture < 2) {
    mVar4 = ma_format_f32;
    if (pDescriptorCapture->format != ma_format_unknown) {
      mVar4 = pDescriptorCapture->format;
    }
    pDescriptorCapture->format = mVar4;
    mVar2 = 2;
    if (pDescriptorCapture->channels != 0) {
      mVar2 = pDescriptorCapture->channels;
    }
    pDescriptorCapture->channels = mVar2;
    mVar5 = 48000;
    if (pDescriptorCapture->sampleRate != 0) {
      mVar5 = pDescriptorCapture->sampleRate;
    }
    pDescriptorCapture->sampleRate = mVar5;
    if (pDescriptorCapture->channelMap[0] == '\0') {
      lVar6 = 0;
      do {
        mVar1 = ma_channel_map_init_standard_channel
                          (ma_standard_channel_map_default,mVar2,(ma_uint32)lVar6);
        pDescriptorCapture->channelMap[lVar6] = mVar1;
        if (mVar2 <= (uint)(lVar6 + 1)) break;
        bVar7 = lVar6 != 0xfd;
        lVar6 = lVar6 + 1;
      } while (bVar7);
    }
    mVar2 = ma_calculate_buffer_size_in_frames_from_descriptor
                      (pDescriptorCapture,pDescriptorCapture->sampleRate,pConfig->performanceProfile
                      );
    pDescriptorCapture->periodSizeInFrames = mVar2;
  }
  else if (pConfig->deviceType == ma_device_type_loopback) {
    return MA_DEVICE_TYPE_NOT_SUPPORTED;
  }
  if ((pConfig->deviceType | ma_device_type_capture) == ma_device_type_duplex) {
    mVar4 = ma_format_f32;
    if (pDescriptorPlayback->format != ma_format_unknown) {
      mVar4 = pDescriptorPlayback->format;
    }
    pDescriptorPlayback->format = mVar4;
    mVar2 = 2;
    if (pDescriptorPlayback->channels != 0) {
      mVar2 = pDescriptorPlayback->channels;
    }
    pDescriptorPlayback->channels = mVar2;
    mVar5 = 48000;
    if (pDescriptorPlayback->sampleRate != 0) {
      mVar5 = pDescriptorPlayback->sampleRate;
    }
    pDescriptorPlayback->sampleRate = mVar5;
    if (pDescriptorPlayback->channelMap[0] == '\0') {
      lVar6 = 0;
      do {
        mVar1 = ma_channel_map_init_standard_channel
                          (ma_standard_channel_map_default,mVar2,(ma_uint32)lVar6);
        pDescriptorPlayback->channelMap[lVar6] = mVar1;
        if (mVar2 <= (uint)(lVar6 + 1)) break;
        bVar7 = lVar6 != 0xfd;
        lVar6 = lVar6 + 1;
      } while (bVar7);
    }
    mVar2 = ma_calculate_buffer_size_in_frames_from_descriptor
                      (pDescriptorPlayback,pDescriptorPlayback->sampleRate,
                       pConfig->performanceProfile);
    pDescriptorPlayback->periodSizeInFrames = mVar2;
  }
  mVar3 = ma_event_init(&(pDevice->field_24).null_device.operationEvent);
  if (((mVar3 == MA_SUCCESS) &&
      (mVar3 = ma_event_init(&(pDevice->field_24).null_device.operationCompletionEvent),
      mVar3 == MA_SUCCESS)) &&
     (mVar3 = ma_semaphore_init(L'\x01',&(pDevice->field_24).null_device.operationSemaphore),
     mVar3 == MA_SUCCESS)) {
    mVar3 = ma_thread_create((ma_thread *)&pDevice->field_24,pDevice->pContext->threadPriority,0,
                             ma_device_thread__null,pDevice,&pDevice->pContext->allocationCallbacks)
    ;
    return mVar3;
  }
  return mVar3;
}

Assistant:

static ma_result ma_device_init__null(ma_device* pDevice, const ma_device_config* pConfig, ma_device_descriptor* pDescriptorPlayback, ma_device_descriptor* pDescriptorCapture)
{
    ma_result result;

    MA_ASSERT(pDevice != NULL);

    MA_ZERO_OBJECT(&pDevice->null_device);

    if (pConfig->deviceType == ma_device_type_loopback) {
        return MA_DEVICE_TYPE_NOT_SUPPORTED;
    }

    /* The null backend supports everything exactly as we specify it. */
    if (pConfig->deviceType == ma_device_type_capture || pConfig->deviceType == ma_device_type_duplex) {
        pDescriptorCapture->format     = (pDescriptorCapture->format     != ma_format_unknown) ? pDescriptorCapture->format     : MA_DEFAULT_FORMAT;
        pDescriptorCapture->channels   = (pDescriptorCapture->channels   != 0)                 ? pDescriptorCapture->channels   : MA_DEFAULT_CHANNELS;
        pDescriptorCapture->sampleRate = (pDescriptorCapture->sampleRate != 0)                 ? pDescriptorCapture->sampleRate : MA_DEFAULT_SAMPLE_RATE;

        if (pDescriptorCapture->channelMap[0] == MA_CHANNEL_NONE) {
            ma_channel_map_init_standard(ma_standard_channel_map_default, pDescriptorCapture->channelMap, ma_countof(pDescriptorCapture->channelMap), pDescriptorCapture->channels);
        }

        pDescriptorCapture->periodSizeInFrames = ma_calculate_buffer_size_in_frames_from_descriptor(pDescriptorCapture, pDescriptorCapture->sampleRate, pConfig->performanceProfile);
    }

    if (pConfig->deviceType == ma_device_type_playback || pConfig->deviceType == ma_device_type_duplex) {
        pDescriptorPlayback->format     = (pDescriptorPlayback->format     != ma_format_unknown) ? pDescriptorPlayback->format     : MA_DEFAULT_FORMAT;
        pDescriptorPlayback->channels   = (pDescriptorPlayback->channels   != 0)                 ? pDescriptorPlayback->channels   : MA_DEFAULT_CHANNELS;
        pDescriptorPlayback->sampleRate = (pDescriptorPlayback->sampleRate != 0)                 ? pDescriptorPlayback->sampleRate : MA_DEFAULT_SAMPLE_RATE;

        if (pDescriptorPlayback->channelMap[0] == MA_CHANNEL_NONE) {
            ma_channel_map_init_standard(ma_standard_channel_map_default, pDescriptorPlayback->channelMap, ma_countof(pDescriptorCapture->channelMap), pDescriptorPlayback->channels);
        }

        pDescriptorPlayback->periodSizeInFrames = ma_calculate_buffer_size_in_frames_from_descriptor(pDescriptorPlayback, pDescriptorPlayback->sampleRate, pConfig->performanceProfile);
    }

    /*
    In order to get timing right, we need to create a thread that does nothing but keeps track of the timer. This timer is started when the
    first period is "written" to it, and then stopped in ma_device_stop__null().
    */
    result = ma_event_init(&pDevice->null_device.operationEvent);
    if (result != MA_SUCCESS) {
        return result;
    }

    result = ma_event_init(&pDevice->null_device.operationCompletionEvent);
    if (result != MA_SUCCESS) {
        return result;
    }

    result = ma_semaphore_init(1, &pDevice->null_device.operationSemaphore);    /* <-- It's important that the initial value is set to 1. */
    if (result != MA_SUCCESS) {
        return result;
    }

    result = ma_thread_create(&pDevice->null_device.deviceThread, pDevice->pContext->threadPriority, 0, ma_device_thread__null, pDevice, &pDevice->pContext->allocationCallbacks);
    if (result != MA_SUCCESS) {
        return result;
    }

    return MA_SUCCESS;
}